

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_int64 localtimeOffset(DateTime *p,sqlite3_context *pCtx,int *pRc)

{
  int iVar1;
  undefined1 local_c8 [4];
  int s;
  tm sLocal;
  time_t t;
  DateTime y;
  DateTime x;
  int *pRc_local;
  sqlite3_context *pCtx_local;
  DateTime *p_local;
  
  memset(local_c8,0,0x38);
  memcpy(&y.validYMD,p,0x30);
  computeYMD_HMS((DateTime *)&y.validYMD);
  computeJD((DateTime *)&y.validYMD);
  sLocal.tm_zone = (char *)((long)y._40_8_ / 1000 + -0x3118a36940);
  iVar1 = osLocaltime((time_t *)&sLocal.tm_zone,(tm *)local_c8);
  if (iVar1 == 0) {
    y.iJD._0_4_ = sLocal.tm_mday + 0x76c;
    y.iJD._4_4_ = sLocal.tm_hour + 1;
    y.Y = sLocal.tm_min;
    y.M = sLocal.tm_sec;
    y.D = s;
    y._24_8_ = (BADTYPE)(int)local_c8;
    y.s._0_1_ = 1;
    y.s._1_1_ = 1;
    y.s._2_1_ = 0;
    y.s._3_1_ = 0;
    computeJD((DateTime *)&t);
    *pRc = 0;
    p_local = (DateTime *)(t - y._40_8_);
  }
  else {
    sqlite3_result_error(pCtx,"local time unavailable",-1);
    *pRc = 1;
    p_local = (DateTime *)0x0;
  }
  return (sqlite3_int64)p_local;
}

Assistant:

static sqlite3_int64 localtimeOffset(
  DateTime *p,                    /* Date at which to calculate offset */
  sqlite3_context *pCtx,          /* Write error here if one occurs */
  int *pRc                        /* OUT: Error code. SQLITE_OK or ERROR */
){
  DateTime x, y;
  time_t t;
  struct tm sLocal;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  x = *p;
  computeYMD_HMS(&x);
  if( x.Y<1971 || x.Y>=2038 ){
    x.Y = 2000;
    x.M = 1;
    x.D = 1;
    x.h = 0;
    x.m = 0;
    x.s = 0.0;
  } else {
    int s = (int)(x.s + 0.5);
    x.s = s;
  }
  x.tz = 0;
  x.validJD = 0;
  computeJD(&x);
  t = (time_t)(x.iJD/1000 - 21086676*(i64)10000);
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    *pRc = SQLITE_ERROR;
    return 0;
  }
  y.Y = sLocal.tm_year + 1900;
  y.M = sLocal.tm_mon + 1;
  y.D = sLocal.tm_mday;
  y.h = sLocal.tm_hour;
  y.m = sLocal.tm_min;
  y.s = sLocal.tm_sec;
  y.validYMD = 1;
  y.validHMS = 1;
  y.validJD = 0;
  y.validTZ = 0;
  computeJD(&y);
  *pRc = SQLITE_OK;
  return y.iJD - x.iJD;
}